

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O1

StringCache * stringcache_create(void)

{
  StringCache *__ptr;
  StringBucket **__s;
  
  __ptr = (StringCache *)malloc(0x18);
  if (__ptr != (StringCache *)0x0) {
    __ptr->hashtable = (StringBucket **)0x0;
    *(undefined8 *)&__ptr->table_size = 0;
    __ptr->d = (void *)0x0;
    __s = (StringBucket **)malloc(0x800);
    __ptr->hashtable = __s;
    if (__s != (StringBucket **)0x0) {
      memset(__s,0,0x800);
      __ptr->table_size = 0x100;
      return __ptr;
    }
    free(__ptr);
  }
  return (StringCache *)0x0;
}

Assistant:

StringCache *stringcache_create(void)
{
    const uint32 initial_table_size = 256;
    const size_t tablelen = sizeof (StringBucket *) * initial_table_size;
    StringCache *cache = (StringCache *) malloc(sizeof (StringCache));
    if (!cache) {
        return NULL;
    }
    memset(cache, '\0', sizeof (StringCache));

    cache->hashtable = (StringBucket **) malloc(tablelen);
    if (!cache->hashtable)
    {
        free(cache);
        return NULL;
    }
    memset(cache->hashtable, '\0', tablelen);

    cache->table_size = initial_table_size;
    return cache;
}